

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_GetKnotVectorDomain(int order,int cv_count,double *knot,double *k0,double *k1)

{
  double *k1_local;
  double *k0_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  if (((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) {
    cv_count_local._3_1_ = false;
  }
  else {
    if (k0 != (double *)0x0) {
      *k0 = knot[order + -2];
    }
    if (k1 != (double *)0x0) {
      *k1 = knot[cv_count + -1];
    }
    cv_count_local._3_1_ = true;
  }
  return cv_count_local._3_1_;
}

Assistant:

bool ON_GetKnotVectorDomain(
       int order,
       int cv_count,
       const double* knot,
       double* k0, double* k1
       )
{
  if ( order < 2 || cv_count < order || knot == nullptr )
    return false;
  if ( k0 )
    *k0 = knot[order-2];
  if ( k1 )
    *k1 = knot[cv_count-1];
  return true;
}